

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

void __thiscall
mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
IndicatorConstraint(IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                    *this,IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                          *param_1)

{
  int iVar1;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  iVar1 = param_1->bv_;
  this->b_ = param_1->b_;
  this->bv_ = iVar1;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
            (&this->con_,&param_1->con_);
  return;
}

Assistant:

static const char* GetTypeName() {
    static std::string name
        { std::string("IndicatorConstraint[") + Con::GetTypeName() + ']' };
    return name.c_str();
  }